

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::BasicAtomicCase2::RunIteration
          (BasicAtomicCase2 *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  uint uVar1;
  BasicAtomicCase2 *pBVar2;
  bool bVar3;
  int i;
  GLuint GVar4;
  long lVar5;
  ostream *poVar6;
  undefined7 in_register_00000009;
  bool *compile_error;
  uint uVar7;
  long lVar8;
  ulong __n;
  uvec3 global_size;
  vector<int,_std::allocator<int>_> idata;
  vector<unsigned_int,_std::allocator<unsigned_int>_> udata;
  undefined8 local_200;
  undefined4 local_1f8;
  long local_1f0;
  BasicAtomicCase2 *local_1e8;
  string local_1e0;
  GLuint *local_1c0;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  local_1f0 = CONCAT44(local_1f0._4_4_,(int)CONCAT71(in_register_00000009,dispatch_indirect));
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  local_1f8 = 0;
  local_200 = 0;
  lVar5 = 0;
  do {
    *(uint *)((long)&local_200 + lVar5 * 4) = num_groups->m_data[lVar5] * param_1->m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_1e8 = this;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"\nlayout(local_size_x = ",0x17);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", local_size_y = ",0x11);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", local_size_z = ",0x11);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,") in;\nconst uvec3 kGlobalSize = uvec3(",0x26);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,");\nlayout(std430, binding = 0) buffer OutputU {\n  uint g_uint_out[",0x42);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"];\n};\nlayout(std430, binding = 1) buffer OutputI {\n  int data[",0x3e);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "];\n} g_int_out;\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  const uint global_index = gl_GlobalInvocationID.x +\n                            gl_GlobalInvocationID.y * kGlobalSize.x +\n                            gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;\n  atomicExchange(g_uint_out[global_index], g_uint_value[0]);\n  atomicMin(g_uint_out[global_index], g_uint_value[1]);\n  atomicMax(g_uint_out[global_index], g_uint_value[2]);\n  atomicAnd(g_uint_out[global_index], g_uint_value[3]);\n  atomicOr(g_uint_out[global_index], g_uint_value[4]);\n  if (g_uint_value[0] > 0u) {\n    barrier();\n    atomicXor(g_uint_out[global_index], g_uint_value[5]);\n  }\n  atomicCompSwap(g_uint_out[global_index], g_uint_value[6], g_uint_value[7]);\n\n  atomicExchange(g_int_out.data[global_index], 3);\n  atomicMin(g_int_out.data[global_index], 1);\n  atomicMax(g_int_out.data[global_index], 2);\n  atomicAnd(g_int_out.data[global_index], 0x1);\n  atomicOr(g_int_out.data[global_index], 0x3);\n  atomicXor(g_int_out.data[global_index], 0x1);\n  atomicCompSwap(g_int_out.data[global_index], 0x2, 0x7);\n}"
             ,0x470);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  pBVar2 = local_1e8;
  GVar4 = ComputeShaderBase::CreateComputeProgram(&local_1e8->super_ComputeShaderBase,&local_1e0);
  pBVar2->m_program = GVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  pBVar2 = local_1e8;
  this_00 = &(local_1e8->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,local_1e8->m_program);
  bVar3 = ComputeShaderBase::CheckProgram
                    (&pBVar2->super_ComputeShaderBase,pBVar2->m_program,compile_error);
  if (bVar3) {
    uVar7 = num_groups->m_data[0] * param_1->m_data[0] * param_1->m_data[1] * num_groups->m_data[1]
            * param_1->m_data[2] * num_groups->m_data[2];
    if (pBVar2->m_storage_buffer[0] == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,2,pBVar2->m_storage_buffer);
    }
    local_1c0 = pBVar2->m_storage_buffer;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,pBVar2->m_storage_buffer[0]);
    __n = (ulong)uVar7;
    lVar5 = __n * 4;
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,lVar5,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,pBVar2->m_storage_buffer[1]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,lVar5,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glUseProgram(this_00,pBVar2->m_program);
    if ((char)local_1f0 == '\0') {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    else {
      local_1f0 = lVar5;
      if (pBVar2->m_dispatch_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&pBVar2->m_dispatch_buffer);
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,pBVar2->m_dispatch_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
      lVar5 = local_1f0;
    }
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,__n,
               (allocator_type *)&local_1e0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*local_1c0);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,lVar5,(void *)local_1b8._0_8_);
    if (uVar7 != 0) {
      lVar8 = 0;
      do {
        if (*(uint *)(local_1b8._0_8_ + lVar8 * 4) != 7) {
          bVar3 = false;
          anon_unknown_0::Output
                    ("uData at index %d is %d should be %d.\n",lVar8,
                     (ulong)*(uint *)(local_1b8._0_8_ + lVar8 * 4),7);
          goto LAB_0091ea3d;
        }
        lVar8 = lVar8 + 1;
      } while (uVar7 != (uint)lVar8);
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_1e0,__n,(allocator_type *)&local_200);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,local_1e8->m_storage_buffer[1]);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,lVar5,local_1e0._M_dataplus._M_p);
    bVar3 = (int)uVar7 < 1;
    if (0 < (int)uVar7) {
      uVar1 = *(uint *)local_1e0._M_dataplus._M_p;
      lVar5 = 0;
      if (uVar1 == 7) {
        lVar5 = 0;
        do {
          if (uVar7 - 1 == (int)lVar5) {
            bVar3 = true;
            goto LAB_0091ea26;
          }
          uVar1 = *(uint *)(local_1e0._M_dataplus._M_p + lVar5 * 4 + 4);
          lVar5 = lVar5 + 1;
        } while (uVar1 == 7);
        bVar3 = (int)uVar7 <= (int)lVar5;
      }
      anon_unknown_0::Output("iData at index %d is %d should be %d.\n",lVar5,(ulong)uVar1,7);
    }
LAB_0091ea26:
    if ((uint *)local_1e0._M_dataplus._M_p != (uint *)0x0) {
      operator_delete(local_1e0._M_dataplus._M_p,
                      local_1e0.field_2._M_allocated_capacity - (long)local_1e0._M_dataplus._M_p);
    }
LAB_0091ea3d:
    if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ - local_1b8._0_8_);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();

		if (m_storage_buffer[0] == 0)
			glGenBuffers(2, m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize, NULL, GL_DYNAMIC_DRAW);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLint) * kBufferSize, NULL, GL_DYNAMIC_DRAW);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		std::vector<GLuint> udata(kBufferSize);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kBufferSize, &udata[0]);
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (udata[i] != 7)
			{
				Output("uData at index %d is %d should be %d.\n", i, udata[i], 7);
				return false;
			}
		}

		std::vector<GLint> idata(kBufferSize);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLint) * kBufferSize, &idata[0]);
		for (GLint i = 0; i < static_cast<GLint>(kBufferSize); ++i)
		{
			if (idata[i] != 7)
			{
				Output("iData at index %d is %d should be %d.\n", i, idata[i], 7);
				return false;
			}
		}

		return true;
	}